

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void disas_simd_scalar_shift_imm(DisasContext_conflict1 *s,uint32_t insn)

{
  byte bVar1;
  bool bVar2;
  _Bool _Var3;
  TCGv_i64 pTVar4;
  TCGv_i64 pTVar5;
  TCGv_i64 tcg_res;
  int iVar6;
  byte bVar7;
  uint opcode;
  _Bool _Var8;
  TCGContext_conflict1 *tcg_ctx;
  uint rd;
  uint uVar9;
  uintptr_t o;
  TCGTemp *ts;
  uint immb;
  uint rn;
  int in_stack_ffffffffffffff98;
  
  uVar9 = insn >> 0x13 & 0xf;
  if ((uVar9 == 0) || (opcode = insn >> 0xb & 0x1f, 0x1f < opcode)) goto switchD_0063a60e_caseD_1;
  rd = insn & 0x1f;
  rn = insn >> 5 & 0x1f;
  immb = insn >> 0x10 & 7;
  bVar1 = (byte)(insn >> 0x18);
  switch(opcode) {
  case 0:
  case 2:
  case 4:
  case 6:
    goto switchD_0063a60e_caseD_0;
  case 8:
    if ((insn >> 0x1d & 1) == 0) break;
switchD_0063a60e_caseD_0:
    if ((insn >> 0x16 & 1) == 0) break;
    tcg_ctx = s->uc->tcg_ctx;
    _Var3 = fp_access_check(s);
    if (!_Var3) {
      return;
    }
    iVar6 = immb + uVar9 * 8;
    pTVar4 = (TCGv_i64)0x0;
    _Var3 = false;
    bVar2 = false;
    bVar7 = 0;
    _Var8 = false;
    switch(opcode) {
    case 2:
      _Var3 = true;
      bVar7 = 0;
      break;
    case 3:
    case 5:
    case 7:
      goto switchD_0063a66e_caseD_3;
    case 6:
      _Var8 = true;
    case 4:
      _Var3 = _Var8;
      pTVar4 = tcg_const_i64_aarch64(tcg_ctx,1L << (~(byte)iVar6 & 0x3f));
      bVar2 = true;
      goto LAB_0063a831;
    case 8:
      bVar7 = 1;
      _Var3 = false;
      break;
    default:
      bVar2 = false;
      _Var3 = false;
LAB_0063a831:
      bVar7 = 0;
      goto switchD_0063a66e_caseD_3;
    }
    bVar2 = false;
    pTVar4 = (TCGv_i64)0x0;
switchD_0063a66e_caseD_3:
    pTVar5 = read_fp_dreg(s,rn);
    if ((_Var3 | bVar7) == 1) {
      tcg_res = read_fp_dreg(s,rd);
    }
    else {
      tcg_res = tcg_temp_new_i64(tcg_ctx);
    }
    if (bVar7 == 0) {
      handle_shri_with_rndacc
                (tcg_ctx,tcg_res,pTVar5,pTVar4,_Var3,(_Bool)(bVar1 >> 5 & 1),3,0x80U - iVar6);
    }
    else if (iVar6 != 0x40) {
      tcg_gen_shri_i64_aarch64(tcg_ctx,pTVar5,pTVar5,(ulong)(0x80U - iVar6));
      tcg_gen_deposit_i64_aarch64(tcg_ctx,tcg_res,tcg_res,pTVar5,0,iVar6 - 0x40);
    }
    write_fp_dreg_aarch64(s,rd,tcg_res);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_res + (long)tcg_ctx));
    if (!bVar2) {
      return;
    }
    ts = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
LAB_0063a990:
    tcg_temp_free_internal_aarch64(tcg_ctx,ts);
    return;
  case 10:
    tcg_ctx = s->uc->tcg_ctx;
    iVar6 = 0x1f;
    if (uVar9 != 0) {
      for (; uVar9 >> iVar6 == 0; iVar6 = iVar6 + -1) {
      }
    }
    new_tmp_a64_aarch64(s);
    new_tmp_a64_aarch64(s);
    if ((insn >> 0x16 & 1) == 0) break;
    _Var3 = fp_access_check(s);
    if (!_Var3) {
      return;
    }
    uVar9 = immb + uVar9 * 8 + (-8 << ((byte)iVar6 & 0x1f));
    pTVar4 = read_fp_dreg(s,rn);
    if ((insn >> 0x1d & 1) == 0) {
      pTVar5 = tcg_temp_new_i64(tcg_ctx);
      tcg_gen_shli_i64_aarch64(tcg_ctx,pTVar5,pTVar4,(long)(int)uVar9);
    }
    else {
      pTVar5 = read_fp_dreg(s,rd);
      tcg_gen_deposit_i64_aarch64(tcg_ctx,pTVar5,pTVar5,pTVar4,uVar9,0x40 - uVar9);
    }
    write_fp_dreg_aarch64(s,rd,pTVar5);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
    ts = (TCGTemp *)(pTVar5 + (long)tcg_ctx);
    goto LAB_0063a990;
  case 0xc:
    if ((insn >> 0x1d & 1) != 0) {
      _Var8 = true;
      _Var3 = false;
      goto LAB_0063a7b5;
    }
    break;
  case 0xe:
    _Var8 = (_Bool)(bVar1 >> 5 & 1);
    _Var3 = _Var8;
LAB_0063a7b5:
    handle_simd_qshl(s,true,false,_Var3,_Var8,uVar9,immb,rn,rd);
    return;
  case 0x10:
  case 0x11:
    if ((insn >> 0x1d & 1) != 0) {
      _Var8 = true;
      _Var3 = false;
      goto LAB_0063a6a8;
    }
    break;
  case 0x12:
  case 0x13:
    _Var8 = (_Bool)(bVar1 >> 5 & 1);
    _Var3 = _Var8;
LAB_0063a6a8:
    handle_vec_simd_sqshrn(s,true,false,_Var3,_Var8,uVar9,immb,opcode,rn,rd);
    return;
  case 0x1c:
    handle_simd_shift_intfp_conv
              (s,true,false,(_Bool)(bVar1 >> 5 & 1),uVar9,immb,rn,rd,in_stack_ffffffffffffff98);
    return;
  case 0x1f:
    handle_simd_shift_fpint_conv(s,true,false,(_Bool)(bVar1 >> 5 & 1),uVar9,immb,rn,rd);
    return;
  }
switchD_0063a60e_caseD_1:
  unallocated_encoding_aarch64(s);
  return;
}

Assistant:

static void disas_simd_scalar_shift_imm(DisasContext *s, uint32_t insn)
{
    int rd = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int opcode = extract32(insn, 11, 5);
    int immb = extract32(insn, 16, 3);
    int immh = extract32(insn, 19, 4);
    bool is_u = extract32(insn, 29, 1);

    if (immh == 0) {
        unallocated_encoding(s);
        return;
    }

    switch (opcode) {
    case 0x08: /* SRI */
        if (!is_u) {
            unallocated_encoding(s);
            return;
        }
        /* fall through */
    case 0x00: /* SSHR / USHR */
    case 0x02: /* SSRA / USRA */
    case 0x04: /* SRSHR / URSHR */
    case 0x06: /* SRSRA / URSRA */
        handle_scalar_simd_shri(s, is_u, immh, immb, opcode, rn, rd);
        break;
    case 0x0a: /* SHL / SLI */
        handle_scalar_simd_shli(s, is_u, immh, immb, opcode, rn, rd);
        break;
    case 0x1c: /* SCVTF, UCVTF */
        handle_simd_shift_intfp_conv(s, true, false, is_u, immh, immb,
                                     opcode, rn, rd);
        break;
    case 0x10: /* SQSHRUN, SQSHRUN2 */
    case 0x11: /* SQRSHRUN, SQRSHRUN2 */
        if (!is_u) {
            unallocated_encoding(s);
            return;
        }
        handle_vec_simd_sqshrn(s, true, false, false, true,
                               immh, immb, opcode, rn, rd);
        break;
    case 0x12: /* SQSHRN, SQSHRN2, UQSHRN */
    case 0x13: /* SQRSHRN, SQRSHRN2, UQRSHRN, UQRSHRN2 */
        handle_vec_simd_sqshrn(s, true, false, is_u, is_u,
                               immh, immb, opcode, rn, rd);
        break;
    case 0xc: /* SQSHLU */
        if (!is_u) {
            unallocated_encoding(s);
            return;
        }
        handle_simd_qshl(s, true, false, false, true, immh, immb, rn, rd);
        break;
    case 0xe: /* SQSHL, UQSHL */
        handle_simd_qshl(s, true, false, is_u, is_u, immh, immb, rn, rd);
        break;
    case 0x1f: /* FCVTZS, FCVTZU */
        handle_simd_shift_fpint_conv(s, true, false, is_u, immh, immb, rn, rd);
        break;
    default:
        unallocated_encoding(s);
        break;
    }
}